

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_SubDFromSurfaceParameters *
Internal_InitSubDFromSurfaceParameters
          (ON_SubDFromSurfaceParameters *__return_storage_ptr__,Methods method,bool bCorners)

{
  undefined7 in_register_00000031;
  
  __return_storage_ptr__->m_method = SubDFriendlyFit;
  *(undefined8 *)&__return_storage_ptr__->m_bCorners = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->m_reserved3 + 1) = 0;
  __return_storage_ptr__->m_reserved4 = 0.0;
  if ((int)CONCAT71(in_register_00000031,method) != 0) {
    ON_SubDFromSurfaceParameters::SetMethod(__return_storage_ptr__,method);
  }
  ON_SubDFromSurfaceParameters::SetCorners(__return_storage_ptr__,bCorners);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SubDFromSurfaceParameters Internal_InitSubDFromSurfaceParameters(
  ON_SubDFromSurfaceParameters::Methods method,
  bool bCorners
  )
{
  ON_SubDFromSurfaceParameters p;
  if (ON_SubDFromSurfaceParameters::Methods::Unset != method)
    p.SetMethod(method);
  p.SetCorners(bCorners);
  return p;
}